

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyDiscardElement(TidyDocImpl *doc,Node *element)

{
  Node *pNVar1;
  
  if (element == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    pNVar1 = element->next;
    prvTidyRemoveNode(element);
    prvTidyFreeNode(doc,element);
  }
  return pNVar1;
}

Assistant:

Node *TY_(DiscardElement)( TidyDocImpl* doc, Node *element )
{
    Node *next = NULL;

    if (element)
    {
        next = element->next;
        TY_(RemoveNode)(element);
        TY_(FreeNode)( doc, element);
    }

    return next;
}